

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

void __thiscall re2::PCRE::~PCRE(PCRE *this)

{
  string *this_00;
  PCRE *this_local;
  
  if (this->re_full_ != (pcre *)0x0) {
    pcre_free(this->re_full_);
  }
  if (this->re_partial_ != (pcre *)0x0) {
    pcre_free(this->re_partial_);
  }
  if ((this->error_ != (string *)empty_string_abi_cxx11_) &&
     (this_00 = (string *)this->error_, this_00 != (string *)0x0)) {
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PCRE::~PCRE() {
  if (re_full_ != NULL)         pcre_free(re_full_);
  if (re_partial_ != NULL)      pcre_free(re_partial_);
  if (error_ != &empty_string)  delete error_;
}